

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

bool chaiscript::bootstrap::Bootstrap::has_parse_tree(Const_Proxy_Function *t_pf)

{
  bool bVar1;
  undefined1 local_20 [8];
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> pf;
  Const_Proxy_Function *t_pf_local;
  
  pf.
  super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_pf;
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  Catch::clara::std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)local_20);
  return bVar1;
}

Assistant:

static bool has_parse_tree(const chaiscript::Const_Proxy_Function &t_pf) noexcept {
      const auto pf = std::dynamic_pointer_cast<const chaiscript::dispatch::Dynamic_Proxy_Function>(t_pf);
      return bool(pf);
    }